

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O0

bool __thiscall Heuristics::existsInVisited(Heuristics *this,Table possibleState)

{
  bool bVar1;
  reference pTVar2;
  undefined1 local_48 [8];
  Table table;
  iterator __end1;
  iterator __begin1;
  vector<Table,_std::allocator<Table>_> *__range1;
  Heuristics *this_local;
  
  __end1 = std::vector<Table,_std::allocator<Table>_>::begin(&this->visited);
  table._16_8_ = std::vector<Table,_std::allocator<Table>_>::end(&this->visited);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_>
                                *)&table.current_col);
    if (!bVar1) {
      return false;
    }
    pTVar2 = __gnu_cxx::__normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_>::
             operator*(&__end1);
    local_48 = *(undefined1 (*) [8])pTVar2->table;
    table.table._0_8_ = *(undefined8 *)(pTVar2->table[2] + 2);
    table._8_8_ = *(undefined8 *)&pTVar2->current_col;
    bVar1 = Table::equals((Table *)local_48,possibleState);
    if (bVar1) break;
    __gnu_cxx::__normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_>::operator++
              (&__end1);
  }
  return true;
}

Assistant:

bool Heuristics::existsInVisited(Table possibleState) {
    for (auto table : this->visited) {
        if(table.equals(possibleState)){
            return true;
        }
    }
    return false;
}